

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

bool __thiscall
LinearSystem::PerformOperation
          (LinearSystem *this,OperationType operation_type,int lhs,int rhs,Fraction coefficient)

{
  bool bVar1;
  Operation operation;
  Operation local_24;
  
  if (operation_type == MainOutput) {
    bVar1 = AddMainOutput(this);
    return bVar1;
  }
  local_24.operation_type = operation_type;
  local_24.lhs = lhs;
  local_24.rhs = rhs;
  local_24.coefficient = coefficient;
  bVar1 = ApplyOperation(this,&local_24);
  if (bVar1) {
    std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::push_back
              (&this->history_,&local_24);
  }
  return bVar1;
}

Assistant:

bool LinearSystem::PerformOperation(LinearSystem::OperationType operation_type, int lhs,
                                    int rhs, Fraction coefficient) {
  if (operation_type == OperationType::MainOutput) {
    return AddMainOutput();
  }

  Operation operation(operation_type, lhs, rhs, coefficient);
  if (ApplyOperation(operation)) {
    history_.push_back(operation);
    return true;
  }

  return false;
}